

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

string * directories::MADPGetResultsFilename(string *method,PlanningUnit *pu,Arguments *args)

{
  MultiAgentDecisionProcessInterface *pMVar1;
  PlanningUnit *in_RDX;
  string *in_RDI;
  Arguments *in_stack_000001d8;
  string *in_stack_000001e0;
  string *in_stack_000001e8;
  char *in_stack_ffffffffffffff30;
  string *__lhs;
  string local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  PlanningUnit *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string local_60 [32];
  string local_40 [40];
  PlanningUnit *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  MADPGetResultsDir(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(__lhs,in_stack_ffffffffffffff30);
  pMVar1 = PlanningUnit::GetProblem(local_18);
  (*pMVar1->_vptr_MultiAgentDecisionProcessInterface[4])(local_b0);
  MADPGetResultsBaseFilename(in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  return in_RDI;
}

Assistant:

string directories::MADPGetResultsFilename(const string & method,
                                           const PlanningUnit &pu,
                                           const
                                           ArgumentHandlers::Arguments &args)
{
    return(MADPGetResultsDir(method,pu) + "/" +
           MADPGetResultsBaseFilename(method,pu.GetProblem()->GetUnixName(),
                                      args));
}